

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  undefined1 uVar1;
  undefined2 uVar2;
  uint uVar3;
  pointer pIVar4;
  SectionStats *in_RDI;
  SectionStats testCaseSectionStats;
  bool missingAssertions;
  Counts assertions;
  TestFailureException *anon_var_0;
  AssertionReaction dummyReaction;
  RedirectedStreams redirectedStreams;
  Timer timer;
  double duration;
  Counts prevAssertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  AssertionInfo *in_stack_fffffffffffffd88;
  AssertionInfo *in_stack_fffffffffffffd90;
  SectionInfo *this_00;
  RunContext *in_stack_fffffffffffffd98;
  undefined5 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda5;
  undefined2 in_stack_fffffffffffffda6;
  SectionInfo *_sectionInfo;
  undefined1 local_240 [16];
  RedirectedStreams *in_stack_fffffffffffffdd0;
  Timer local_f0;
  SectionInfo local_e8;
  ostream *local_98;
  size_type sStack_90;
  size_type local_88;
  undefined1 local_70 [80];
  TestCaseInfo *local_20;
  
  local_20 = TestCase::getTestCaseInfo
                       ((TestCase *)(in_RDI->sectionInfo).description.field_2._M_allocated_capacity)
  ;
  SectionInfo::SectionInfo
            ((SectionInfo *)
             CONCAT26(in_stack_fffffffffffffda6,
                      CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0)),
             (SourceLineInfo *)in_stack_fffffffffffffd98,(string *)in_stack_fffffffffffffd90);
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x126d22);
  (*pIVar4->_vptr_IStreamingReporter[7])(pIVar4,local_70);
  local_88 = in_RDI[2].sectionInfo.name.field_2._M_allocated_capacity;
  local_98 = *(ostream **)&in_RDI[2].sectionInfo.name;
  sStack_90 = in_RDI[2].sectionInfo.name._M_string_length;
  local_e8.lineInfo.line = 0;
  in_RDI[4].sectionInfo.name.field_0x1 = 1;
  _sectionInfo = &local_e8;
  operator____sr((char *)in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90);
  local_e8.name.field_2._8_8_ = (local_20->lineInfo).file;
  local_e8.description._0_8_ = (local_20->lineInfo).line;
  StringRef::StringRef((StringRef *)0x126dad);
  local_e8.lineInfo.file._0_4_ = 1;
  AssertionInfo::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  AssertionInfo::~AssertionInfo(in_stack_fffffffffffffd90);
  clara::std::__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            in_stack_fffffffffffffd90);
  seedRng((IConfig *)in_stack_fffffffffffffd90);
  Timer::Timer(&local_f0);
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x126e11);
  uVar3 = (*pIVar4->_vptr_IStreamingReporter[2])();
  uVar2 = (undefined2)uVar3;
  if ((uVar3 & 1) == 0) {
    Timer::start((Timer *)in_stack_fffffffffffffd90);
    invokeActiveTestCase
              ((RunContext *)
               CONCAT26(uVar2,CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0)));
  }
  else {
    RedirectedStreams::RedirectedStreams
              ((RedirectedStreams *)in_RDI,&_sectionInfo->name,
               (string *)
               CONCAT26(uVar2,CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0)));
    Timer::start((Timer *)in_stack_fffffffffffffd90);
    invokeActiveTestCase
              ((RunContext *)
               CONCAT26(uVar2,CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0)));
    RedirectedStreams::~RedirectedStreams(in_stack_fffffffffffffdd0);
  }
  this_00 = (SectionInfo *)Timer::getElapsedSeconds((Timer *)0x1270b4);
  local_e8.lineInfo.line = (size_t)this_00;
  Counts::operator-((Counts *)
                    CONCAT26(uVar2,CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0)),
                    (Counts *)in_stack_fffffffffffffd98);
  uVar1 = testForMissingAssertions(in_stack_fffffffffffffd98,(Counts *)this_00);
  (**(code **)(**(long **)((long)&(in_RDI->sectionInfo).description.field_2 + 8) + 0x40))();
  handleUnfinishedSections((RunContext *)CONCAT26(uVar2,CONCAT15(uVar1,in_stack_fffffffffffffda0)));
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x126f87);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
            ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)0x126f98);
  SectionStats::SectionStats
            (in_RDI,_sectionInfo,(Counts *)CONCAT26(uVar2,CONCAT15(uVar1,in_stack_fffffffffffffda0))
             ,(double)in_stack_fffffffffffffd98,SUB81((ulong)this_00 >> 0x38,0));
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x126fd9);
  (*pIVar4->_vptr_IStreamingReporter[0xc])(pIVar4,local_240);
  SectionStats::~SectionStats((SectionStats *)0x126ff6);
  SectionInfo::~SectionInfo(this_00);
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        seedRng(*m_config);

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }